

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambdaref_expression.cpp
# Opt level: O2

string * __thiscall
duckdb::LambdaRefExpression::GetName_abi_cxx11_
          (string *__return_storage_ptr__,LambdaRefExpression *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->column_name);
  return __return_storage_ptr__;
}

Assistant:

string LambdaRefExpression::GetName() const {
	return column_name;
}